

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::CheckInvariants(GraphCycles *this)

{
  uint uVar1;
  Rep *pRVar2;
  Node *pNVar3;
  Node *pNVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  NodeSet ranks;
  
  pRVar2 = this->rep_;
  anon_unknown_0::NodeSet::NodeSet(&ranks);
  if ((pRVar2->nodes_).size_ == 0) {
LAB_00348750:
    anon_unknown_0::Vec<int>::~Vec(&ranks.table_);
    return true;
  }
  uVar7 = 0;
LAB_00348661:
  pNVar3 = (pRVar2->nodes_).ptr_[uVar7];
  if (pNVar3->masked_ptr != 0xf03a5f7bf03a5f7b) {
    uVar10 = pNVar3->masked_ptr ^ 0xf03a5f7bf03a5f7b;
    uVar6 = (pRVar2->ptrmap_).table_._M_elems
            [(uint)((int)uVar10 + (int)(uVar10 / 0x3fffb) * -0x3fffb)];
    if (uVar6 == 0xffffffff) {
      uVar10 = 0xffffffff;
    }
    else {
      do {
        pNVar4 = ((pRVar2->ptrmap_).nodes_)->ptr_[uVar6];
        if ((pNVar4->masked_ptr ^ uVar10) == 0xf03a5f7bf03a5f7b) goto LAB_003486cb;
        uVar6 = pNVar4->next_hash;
      } while (uVar6 != 0xffffffff);
      uVar6 = 0xffffffff;
LAB_003486cb:
      uVar10 = (ulong)uVar6;
    }
    if (uVar10 != uVar7) {
      raw_log_internal::RawLog
                (kFatal,"graphcycles.cc",400,"Did not find live node in hash table %u %p",
                 uVar7 & 0xffffffff);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                    ,400,"bool absl::synchronization_internal::GraphCycles::CheckInvariants() const"
                   );
    }
  }
  if (pNVar3->visited == true) {
    raw_log_internal::RawLog
              (kFatal,"graphcycles.cc",0x193,"Did not clear visited marker on node %u",
               uVar7 & 0xffffffff);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                  ,0x193,"bool absl::synchronization_internal::GraphCycles::CheckInvariants() const"
                 );
  }
  bVar5 = anon_unknown_0::NodeSet::insert(&ranks,pNVar3->rank);
  if (!bVar5) {
    raw_log_internal::RawLog
              (kFatal,"graphcycles.cc",0x196,"Duplicate occurrence of rank %d",
               (ulong)(uint)pNVar3->rank);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                  ,0x196,"bool absl::synchronization_internal::GraphCycles::CheckInvariants() const"
                 );
  }
  uVar6 = (pNVar3->out).table_.size_;
  uVar10 = 0;
  do {
    uVar8 = uVar10;
    if ((uint)uVar10 <= uVar6) {
      uVar8 = (ulong)uVar6;
    }
    lVar9 = 0;
    do {
      if (uVar8 - uVar10 == lVar9) {
        uVar7 = uVar7 + 1;
        if ((pRVar2->nodes_).size_ <= uVar7) goto LAB_00348750;
        goto LAB_00348661;
      }
      lVar11 = (long)(pNVar3->out).table_.ptr_[uVar10 + lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar11 < 0);
    uVar1 = (pRVar2->nodes_).ptr_[lVar11]->rank;
    uVar10 = (ulong)((uint)uVar10 + (int)lVar9);
    if ((int)uVar1 <= pNVar3->rank) {
      raw_log_internal::RawLog
                (kFatal,"graphcycles.cc",0x19e,"Edge %u ->%d has bad rank assignment %d->%d",
                 uVar7 & 0xffffffff,lVar11,(ulong)(uint)pNVar3->rank,(ulong)uVar1);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                    ,0x19e,
                    "bool absl::synchronization_internal::GraphCycles::CheckInvariants() const");
    }
  } while( true );
}

Assistant:

bool GraphCycles::CheckInvariants() const {
  Rep* r = rep_;
  NodeSet ranks;  // Set of ranks seen so far.
  for (uint32_t x = 0; x < r->nodes_.size(); x++) {
    Node* nx = r->nodes_[x];
    void* ptr = base_internal::UnhidePtr<void>(nx->masked_ptr);
    if (ptr != nullptr && static_cast<uint32_t>(r->ptrmap_.Find(ptr)) != x) {
      ABSL_RAW_LOG(FATAL, "Did not find live node in hash table %" PRIu32 " %p",
                   x, ptr);
    }
    if (nx->visited) {
      ABSL_RAW_LOG(FATAL, "Did not clear visited marker on node %" PRIu32, x);
    }
    if (!ranks.insert(nx->rank)) {
      ABSL_RAW_LOG(FATAL, "Duplicate occurrence of rank %" PRId32, nx->rank);
    }
    HASH_FOR_EACH(y, nx->out) {
      Node* ny = r->nodes_[static_cast<uint32_t>(y)];
      if (nx->rank >= ny->rank) {
        ABSL_RAW_LOG(FATAL,
                     "Edge %" PRIu32 " ->%" PRId32
                     " has bad rank assignment %" PRId32 "->%" PRId32,
                     x, y, nx->rank, ny->rank);
      }
    }
  }
  return true;
}